

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O3

SharedPtr<const_ElementDefinition> __thiscall
Rml::StyleSheet::GetElementDefinition(StyleSheet *this,Element *element)

{
  Element **this_00;
  ObserverPtrBlock *pOVar1;
  undefined8 *puVar2;
  pointer ppEVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  code *pcVar5;
  Box *pBVar6;
  pointer ppSVar7;
  pointer ppSVar8;
  Element *pEVar9;
  StyleSheet *pSVar10;
  bool bVar11;
  int iVar12;
  String *pSVar13;
  String *__s;
  ElementStyle *this_01;
  StringList *pSVar14;
  size_t sVar15;
  Vector2f VVar16;
  long lVar17;
  pointer pPVar18;
  ulong uVar19;
  type psVar20;
  _Head_base<0UL,_Rml::StyleSheetNode_*,_false> _Var21;
  Element *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var22;
  String *name;
  pointer __s_00;
  __normal_iterator<const_Rml::StyleSheetNode_**,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>_>
  __i;
  pointer ppSVar23;
  undefined8 *puVar24;
  ObserverPtrBlock *pOVar25;
  pointer ppEVar26;
  long lVar27;
  SharedPtr<const_ElementDefinition> SVar28;
  StyleSheetNode *node;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_69;
  Element *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  Element *local_58;
  StyleSheet *local_50;
  String *local_48;
  Table<true,_80UL,_unsigned_long,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_robin_hood::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>_>
  *local_40;
  pointer local_38;
  
  local_58 = element;
  if (GetElementDefinition(Rml::Element_const*)::rmlui_nonrecursive_entered == '\x01') {
    bVar11 = Assert("A method defined as non-recursive was entered twice!",
                    "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/Debug.h"
                    ,0x75);
    if (!bVar11) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
  }
  GetElementDefinition(Rml::Element_const*)::rmlui_nonrecursive_entered = 1;
  if (GetElementDefinition(Rml::Element_const*)::applicable_nodes == '\0') {
    GetElementDefinition();
  }
  if (GetElementDefinition::applicable_nodes.
      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      GetElementDefinition::applicable_nodes.
      super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    GetElementDefinition::applicable_nodes.
    super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         GetElementDefinition::applicable_nodes.
         super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  pSVar13 = Element::GetTagName_abi_cxx11_(in_RDX);
  local_50 = this;
  __s = Element::GetId_abi_cxx11_(in_RDX);
  this_01 = Element::GetStyle(in_RDX);
  pSVar14 = ElementStyle::GetClassNameList_abi_cxx11_(this_01);
  iVar12 = ::std::__cxx11::string::compare((char *)pSVar13);
  _Var22._M_pi = extraout_RDX;
  if (iVar12 != 0) {
    local_48 = pSVar13;
    if (__s->_M_string_length != 0) {
      this_00 = &local_58->offset_parent;
      local_68 = (Element *)
                 ::std::
                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator()(&local_69,__s);
      sVar15 = robin_hood::detail::
               Table<true,_80UL,_unsigned_long,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_robin_hood::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>_>
               ::findIdx<unsigned_long>
                         ((Table<true,_80UL,_unsigned_long,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_robin_hood::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>_>
                           *)this_00,(unsigned_long *)&local_68);
      VVar16 = (Vector2f)(&local_58->offset_parent->super_ScriptInterface + sVar15 * 4);
      if (VVar16 != local_58->relative_offset_base) {
        pOVar25 = ((EnableObserverPtr<Rml::Element> *)((long)VVar16 + 8))->block;
        pOVar1 = *(ObserverPtrBlock **)((long)VVar16 + 0x10);
        if (pOVar25 != pOVar1) {
          do {
            local_68 = *(Element **)pOVar25;
            bVar11 = StyleSheetNode::IsApplicable((StyleSheetNode *)local_68,in_RDX,(Element *)0x0);
            if (bVar11) {
              if (GetElementDefinition::applicable_nodes.
                  super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  GetElementDefinition::applicable_nodes.
                  super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>
                ::_M_realloc_insert<Rml::StyleSheetNode_const*const&>
                          ((vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>
                            *)&GetElementDefinition::applicable_nodes,
                           (iterator)
                           GetElementDefinition::applicable_nodes.
                           super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(StyleSheetNode **)&local_68);
              }
              else {
                *GetElementDefinition::applicable_nodes.
                 super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = (StyleSheetNode *)local_68;
                GetElementDefinition::applicable_nodes.
                super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     GetElementDefinition::applicable_nodes.
                     super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            pOVar25 = (ObserverPtrBlock *)&pOVar25->pointed_to_object;
          } while (pOVar25 != pOVar1);
        }
      }
    }
    __s_00 = (pSVar14->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_38 = (pSVar14->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (__s_00 != local_38) {
      local_40 = (Table<true,_80UL,_unsigned_long,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_robin_hood::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>_>
                  *)&local_58->main_box;
      do {
        local_68 = (Element *)
                   ::std::
                   hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator()(&local_69,__s_00);
        sVar15 = robin_hood::detail::
                 Table<true,_80UL,_unsigned_long,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_robin_hood::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>_>
                 ::findIdx<unsigned_long>(local_40,(unsigned_long *)&local_68);
        lVar17 = sVar15 * 0x20 + (long)(local_58->main_box).content;
        if (lVar17 != *(long *)(local_58->main_box).area_edges[0]) {
          puVar2 = *(undefined8 **)(lVar17 + 0x10);
          for (puVar24 = *(undefined8 **)(lVar17 + 8); puVar24 != puVar2; puVar24 = puVar24 + 1) {
            local_68 = (Element *)*puVar24;
            bVar11 = StyleSheetNode::IsApplicable((StyleSheetNode *)local_68,in_RDX,(Element *)0x0);
            if (bVar11) {
              if (GetElementDefinition::applicable_nodes.
                  super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  GetElementDefinition::applicable_nodes.
                  super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>
                ::_M_realloc_insert<Rml::StyleSheetNode_const*const&>
                          ((vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>
                            *)&GetElementDefinition::applicable_nodes,
                           (iterator)
                           GetElementDefinition::applicable_nodes.
                           super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(StyleSheetNode **)&local_68);
              }
              else {
                *GetElementDefinition::applicable_nodes.
                 super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = (StyleSheetNode *)local_68;
                GetElementDefinition::applicable_nodes.
                super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     GetElementDefinition::applicable_nodes.
                     super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
          }
        }
        __s_00 = __s_00 + 1;
      } while (__s_00 != local_38);
    }
    pBVar6 = &local_58->main_box;
    local_68 = (Element *)
               ::std::
               hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator()(&local_69,local_48);
    sVar15 = robin_hood::detail::
             Table<true,_80UL,_unsigned_long,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_robin_hood::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>_>
             ::findIdx<unsigned_long>
                       ((Table<true,_80UL,_unsigned_long,_std::vector<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>,_robin_hood::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>_>
                         *)(pBVar6->area_edges[2] + 2),(unsigned_long *)&local_68);
    pPVar18 = (pointer)(sVar15 * 0x20 + *(long *)((local_58->main_box).area_edges[2] + 2));
    _Var22._M_pi = extraout_RDX_00;
    if (pPVar18 !=
        (local_58->additional_boxes).
        super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      puVar24 = *(undefined8 **)(pPVar18->box).area_edges[0];
      puVar2 = *(undefined8 **)((long)(pPVar18->box).area_edges[0] + 8);
      if (puVar24 != puVar2) {
        do {
          local_68 = (Element *)*puVar24;
          bVar11 = StyleSheetNode::IsApplicable((StyleSheetNode *)local_68,in_RDX,(Element *)0x0);
          _Var22._M_pi = extraout_RDX_01;
          if (bVar11) {
            if (GetElementDefinition::applicable_nodes.
                super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                GetElementDefinition::applicable_nodes.
                super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>::
              _M_realloc_insert<Rml::StyleSheetNode_const*const&>
                        ((vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>
                          *)&GetElementDefinition::applicable_nodes,
                         (iterator)
                         GetElementDefinition::applicable_nodes.
                         super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(StyleSheetNode **)&local_68);
              _Var22._M_pi = extraout_RDX_02;
            }
            else {
              *GetElementDefinition::applicable_nodes.
               super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish = (StyleSheetNode *)local_68;
              GetElementDefinition::applicable_nodes.
              super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   GetElementDefinition::applicable_nodes.
                   super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          puVar24 = puVar24 + 1;
        } while (puVar24 != puVar2);
      }
    }
    ppEVar26 = (local_58->stacking_context).
               super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppEVar3 = (local_58->stacking_context).
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppEVar26 != ppEVar3) {
      do {
        local_68 = *ppEVar26;
        bVar11 = StyleSheetNode::IsApplicable((StyleSheetNode *)local_68,in_RDX,(Element *)0x0);
        _Var22._M_pi = extraout_RDX_03;
        if (bVar11) {
          if (GetElementDefinition::applicable_nodes.
              super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              GetElementDefinition::applicable_nodes.
              super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>::
            _M_realloc_insert<Rml::StyleSheetNode_const*const&>
                      ((vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>
                        *)&GetElementDefinition::applicable_nodes,
                       (iterator)
                       GetElementDefinition::applicable_nodes.
                       super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(StyleSheetNode **)&local_68);
            _Var22._M_pi = extraout_RDX_04;
          }
          else {
            *GetElementDefinition::applicable_nodes.
             super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = (StyleSheetNode *)local_68;
            GetElementDefinition::applicable_nodes.
            super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 GetElementDefinition::applicable_nodes.
                 super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        ppEVar26 = ppEVar26 + 1;
      } while (ppEVar26 != ppEVar3);
    }
    ppSVar8 = GetElementDefinition::applicable_nodes.
              super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppSVar7 = GetElementDefinition::applicable_nodes.
              super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (GetElementDefinition::applicable_nodes.
        super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        GetElementDefinition::applicable_nodes.
        super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar27 = (long)GetElementDefinition::applicable_nodes.
                     super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)GetElementDefinition::applicable_nodes.
                     super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = lVar27 >> 3;
      lVar17 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Rml::StyleSheetNode_const**,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Rml::StyleSheet::GetElementDefinition(Rml::Element_const*)const::__1>>
                (GetElementDefinition::applicable_nodes.
                 super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 GetElementDefinition::applicable_nodes.
                 super__Vector_base<const_Rml::StyleSheetNode_*,_std::allocator<const_Rml::StyleSheetNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar27 < 0x81) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Rml::StyleSheetNode_const**,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Rml::StyleSheet::GetElementDefinition(Rml::Element_const*)const::__1>>
                  (ppSVar7,ppSVar8);
      }
      else {
        ppSVar23 = ppSVar7 + 0x10;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Rml::StyleSheetNode_const**,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<Rml::StyleSheet::GetElementDefinition(Rml::Element_const*)const::__1>>
                  (ppSVar7,ppSVar23);
        for (; ppSVar23 != ppSVar8; ppSVar23 = ppSVar23 + 1) {
          ::std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Rml::StyleSheetNode_const**,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<Rml::StyleSheet::GetElementDefinition(Rml::Element_const*)const::__1>>
                    (ppSVar23);
        }
      }
      psVar20 = robin_hood::detail::
                Table<true,80ul,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,std::shared_ptr<Rml::ElementDefinition_const>,robin_hood::hash<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,void>,std::equal_to<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>>
                ::
                doCreateByKey<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>const&,std::shared_ptr<Rml::ElementDefinition_const>>
                          ((Table<true,80ul,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,std::shared_ptr<Rml::ElementDefinition_const>,robin_hood::hash<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>,void>,std::equal_to<std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>>>
                            *)&local_58->transform_state,&GetElementDefinition::applicable_nodes);
      pSVar10 = local_50;
      _Var21._M_head_impl =
           (StyleSheetNode *)
           (psVar20->super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      _Var22._M_pi = extraout_RDX_05;
      if (_Var21._M_head_impl == (StyleSheetNode *)0x0) {
        local_68 = (Element *)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Rml::ElementDefinition_const,std::allocator<Rml::ElementDefinition>,std::vector<Rml::StyleSheetNode_const*,std::allocator<Rml::StyleSheetNode_const*>>&>
                  (&_Stack_60,(ElementDefinition **)&local_68,
                   (allocator<Rml::ElementDefinition> *)&local_69,
                   &GetElementDefinition::applicable_nodes);
        _Var22._M_pi = _Stack_60._M_pi;
        pEVar9 = local_68;
        local_68 = (Element *)0x0;
        _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var4 = (psVar20->
                 super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        (psVar20->super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = (element_type *)pEVar9;
        (psVar20->super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = _Var22._M_pi;
        _Var22._M_pi = extraout_RDX_06;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
          _Var22._M_pi = extraout_RDX_07;
          if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
            _Var22._M_pi = extraout_RDX_08;
          }
        }
        _Var21._M_head_impl =
             (StyleSheetNode *)
             (psVar20->super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
      }
      (pSVar10->root)._M_t.
      super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>._M_t.
      super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>.
      super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl = _Var21._M_head_impl;
      p_Var4 = (psVar20->
               super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&pSVar10->specificity_offset = p_Var4;
      local_50 = pSVar10;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      goto LAB_00266b5f;
    }
  }
  (local_50->root)._M_t.
  super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>._M_t.
  super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>.
  super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl = (StyleSheetNode *)0x0;
  *(undefined8 *)&local_50->specificity_offset = 0;
LAB_00266b5f:
  GetElementDefinition(Rml::Element_const*)::rmlui_nonrecursive_entered = 0;
  SVar28.super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var22._M_pi;
  SVar28.super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_50;
  return (SharedPtr<const_ElementDefinition>)
         SVar28.super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<const ElementDefinition> StyleSheet::GetElementDefinition(const Element* element) const
{
	RMLUI_ASSERT_NONRECURSIVE;

	// Using static to avoid allocations. Make sure we don't call this function recursively.
	static Vector<const StyleSheetNode*> applicable_nodes;
	applicable_nodes.clear();

	auto AddApplicableNodes = [element](const StyleSheetIndex::NodeIndex& node_index, const String& key) {
		auto it_nodes = node_index.find(Hash<String>()(key));
		if (it_nodes != node_index.end())
		{
			const StyleSheetIndex::NodeList& nodes = it_nodes->second;

			for (const StyleSheetNode* node : nodes)
			{
				// We found a node that has at least one requirement matching the element. Now see if we satisfy the remaining requirements of the
				// node, including all ancestor nodes. What this involves is traversing the style nodes backwards, trying to match nodes in the
				// element's hierarchy to nodes in the style hierarchy.
				if (node->IsApplicable(element, nullptr))
					applicable_nodes.push_back(node);
			}
		}
	};

	// See if there are any styles defined for this element.
	const String& tag = element->GetTagName();
	const String& id = element->GetId();
	const StringList& class_names = element->GetStyle()->GetClassNameList();

	// Text elements are never matched.
	if (tag == "#text")
		return nullptr;

	// First, look up the indexed requirements.
	if (!id.empty())
		AddApplicableNodes(styled_node_index.ids, id);

	for (const String& name : class_names)
		AddApplicableNodes(styled_node_index.classes, name);

	AddApplicableNodes(styled_node_index.tags, tag);

	// Also check all remaining nodes that don't contain any indexed requirements.
	for (const StyleSheetNode* node : styled_node_index.other)
	{
		if (node->IsApplicable(element, nullptr))
			applicable_nodes.push_back(node);
	}

	// If this element definition won't actually store any information, don't bother with it.
	if (applicable_nodes.empty())
		return nullptr;

	// Sort the applicable nodes by specificity first, then by pointer value in case we have duplicate specificities.
	std::sort(applicable_nodes.begin(), applicable_nodes.end(), [](const StyleSheetNode* a, const StyleSheetNode* b) {
		const int a_specificity = a->GetSpecificity();
		const int b_specificity = b->GetSpecificity();
		if (a_specificity == b_specificity)
			return a < b;
		return a_specificity < b_specificity;
	});

	// Check if this puppy has already been cached in the node index.
	SharedPtr<const ElementDefinition>& definition = node_cache[applicable_nodes];
	if (!definition)
	{
		// Otherwise, create a new definition and add it to our cache.
		definition = MakeShared<const ElementDefinition>(applicable_nodes);
	}

	return definition;
}